

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

int tnt_request_set_exprz(tnt_request *req,char *expr)

{
  char *pcVar1;
  size_t sVar2;
  char *expr_local;
  tnt_request *req_local;
  
  if ((req->hdr).type == TNT_OP_EVAL) {
    if (expr == (char *)0x0) {
      req_local._4_4_ = -1;
    }
    else {
      req->key = expr;
      pcVar1 = req->key;
      sVar2 = strlen(req->key);
      req->key_end = pcVar1 + sVar2;
      req_local._4_4_ = 0;
    }
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

int
tnt_request_set_exprz(struct tnt_request *req, const char *expr)
{
	if (req->hdr.type != TNT_OP_EVAL)
		return -1;
	if (!expr)
		return -1;
	req->key = expr; req->key_end = req->key + strlen(req->key);
	return 0;
}